

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::anon_unknown_0::PartialUpdateTest::PartialUpdateTest
          (PartialUpdateTest *this,EglTestContext *eglTestCtx,
          vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
          *oddFrameDrawType,
          vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
          *evenFrameDrawType,char *name,char *description)

{
  deUint32 dVar1;
  
  TestCase::TestCase(&this->super_TestCase,eglTestCtx,name,glcts::fixed_sample_locations_values + 1)
  ;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__PartialUpdateTest_02114e10;
  this->m_window = (NativeWindow *)0x0;
  this->m_eglContext = (EGLContext)0x0;
  dVar1 = deStringHash(name);
  this->m_seed = dVar1;
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::vector(&this->m_oddFrameDrawType,oddFrameDrawType);
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::vector(&this->m_evenFrameDrawType,evenFrameDrawType);
  this->m_supportBufferAge = false;
  this->m_eglDisplay = (EGLDisplay)0x0;
  this->m_eglSurface = (EGLSurface)0x0;
  glw::Functions::Functions(&this->m_gl);
  this->m_gles2Renderer = (GLES2Renderer *)0x0;
  this->m_refRenderer = (ReferenceRenderer *)0x0;
  return;
}

Assistant:

PartialUpdateTest::PartialUpdateTest (EglTestContext& eglTestCtx,
									  const vector<DrawType>& oddFrameDrawType,
									  const vector<DrawType>& evenFrameDrawType,
									  const char* name, const char* description)
	: TestCase				(eglTestCtx, name, description)
	, m_window				(DE_NULL)
	, m_eglContext			(EGL_NO_CONTEXT)
	, m_seed				(deStringHash(name))
	, m_oddFrameDrawType	(oddFrameDrawType)
	, m_evenFrameDrawType	(evenFrameDrawType)
	, m_supportBufferAge	(false)
	, m_eglDisplay			(EGL_NO_DISPLAY)
	, m_eglSurface			(EGL_NO_SURFACE)
	, m_gles2Renderer		(DE_NULL)
	, m_refRenderer			(DE_NULL)
{
}